

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParseCharProp(xmlRegParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  xmlChar *cur_00;
  xmlRegAtomPtr pxVar3;
  bool bVar4;
  xmlChar *start;
  xmlChar *blockName;
  xmlRegAtomType type;
  int cur;
  xmlRegParserCtxtPtr ctxt_local;
  
  start = (xmlChar *)0x0;
  xVar1 = *ctxt->cur;
  if (xVar1 == 'L') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 'u') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_LETTER_UPPERCASE;
    }
    else if (xVar1 == 'l') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_LETTER_LOWERCASE;
    }
    else if (xVar1 == 't') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_LETTER_TITLECASE;
    }
    else if (xVar1 == 'm') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_LETTER_MODIFIER;
    }
    else if (xVar1 == 'o') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_LETTER_OTHERS;
    }
    else {
      blockName._0_4_ = XML_REGEXP_LETTER;
    }
  }
  else if (xVar1 == 'M') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 'n') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_MARK_NONSPACING;
    }
    else if (xVar1 == 'c') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_MARK_SPACECOMBINING;
    }
    else if (xVar1 == 'e') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_MARK_ENCLOSING;
    }
    else {
      blockName._0_4_ = XML_REGEXP_MARK;
    }
  }
  else if (xVar1 == 'N') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 'd') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_NUMBER_DECIMAL;
    }
    else if (xVar1 == 'l') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_NUMBER_LETTER;
    }
    else if (xVar1 == 'o') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_NUMBER_OTHERS;
    }
    else {
      blockName._0_4_ = XML_REGEXP_NUMBER;
    }
  }
  else if (xVar1 == 'P') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 'c') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_CONNECTOR;
    }
    else if (xVar1 == 'd') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_DASH;
    }
    else if (xVar1 == 's') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_OPEN;
    }
    else if (xVar1 == 'e') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_CLOSE;
    }
    else if (xVar1 == 'i') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_INITQUOTE;
    }
    else if (xVar1 == 'f') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_FINQUOTE;
    }
    else if (xVar1 == 'o') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_PUNCT_OTHERS;
    }
    else {
      blockName._0_4_ = XML_REGEXP_PUNCT;
    }
  }
  else if (xVar1 == 'Z') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 's') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SEPAR_SPACE;
    }
    else if (xVar1 == 'l') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SEPAR_LINE;
    }
    else if (xVar1 == 'p') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SEPAR_PARA;
    }
    else {
      blockName._0_4_ = XML_REGEXP_SEPAR;
    }
  }
  else if (xVar1 == 'S') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 'm') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SYMBOL_MATH;
    }
    else if (xVar1 == 'c') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SYMBOL_CURRENCY;
    }
    else if (xVar1 == 'k') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SYMBOL_MODIFIER;
    }
    else if (xVar1 == 'o') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_SYMBOL_OTHERS;
    }
    else {
      blockName._0_4_ = XML_REGEXP_SYMBOL;
    }
  }
  else if (xVar1 == 'C') {
    ctxt->cur = ctxt->cur + 1;
    xVar1 = *ctxt->cur;
    if (xVar1 == 'c') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_OTHER_CONTROL;
    }
    else if (xVar1 == 'f') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_OTHER_FORMAT;
    }
    else if (xVar1 == 'o') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_OTHER_PRIVATE;
    }
    else if (xVar1 == 'n') {
      ctxt->cur = ctxt->cur + 1;
      blockName._0_4_ = XML_REGEXP_OTHER_NA;
    }
    else {
      blockName._0_4_ = XML_REGEXP_OTHER;
    }
  }
  else {
    if (xVar1 != 'I') {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"Unknown char property");
      return;
    }
    ctxt->cur = ctxt->cur + 1;
    if (*ctxt->cur != 's') {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"IsXXXX expected");
      return;
    }
    ctxt->cur = ctxt->cur + 1;
    cur_00 = ctxt->cur;
    bVar2 = *ctxt->cur;
    if ((((0x60 < bVar2) && (bVar2 < 0x7b)) || ((0x40 < bVar2 && (bVar2 < 0x5b)))) ||
       (((0x2f < bVar2 && (bVar2 < 0x3a)) || (bVar2 == 0x2d)))) {
      ctxt->cur = ctxt->cur + 1;
      bVar2 = *ctxt->cur;
      while( true ) {
        if (((bVar2 < 0x61) || (bVar4 = true, 0x7a < bVar2)) &&
           (((bVar2 < 0x41 || (bVar4 = true, 0x5a < bVar2)) &&
            ((bVar2 < 0x30 || (bVar4 = true, 0x39 < bVar2)))))) {
          bVar4 = bVar2 == 0x2d;
        }
        if (!bVar4) break;
        ctxt->cur = ctxt->cur + 1;
        bVar2 = *ctxt->cur;
      }
    }
    blockName._0_4_ = XML_REGEXP_BLOCK_NAME;
    start = xmlStrndup(cur_00,(int)ctxt->cur - (int)cur_00);
  }
  if (ctxt->atom == (xmlRegAtomPtr)0x0) {
    pxVar3 = xmlRegNewAtom(ctxt,(xmlRegAtomType)blockName);
    ctxt->atom = pxVar3;
    if (ctxt->atom != (xmlRegAtomPtr)0x0) {
      ctxt->atom->valuep = start;
    }
  }
  else if (ctxt->atom->type == XML_REGEXP_RANGES) {
    xmlRegAtomAddRange(ctxt,ctxt->atom,ctxt->neg,(xmlRegAtomType)blockName,0,0,start);
  }
  return;
}

Assistant:

static void
xmlFAParseCharProp(xmlRegParserCtxtPtr ctxt) {
    int cur;
    xmlRegAtomType type = (xmlRegAtomType) 0;
    xmlChar *blockName = NULL;

    cur = CUR;
    if (cur == 'L') {
	NEXT;
	cur = CUR;
	if (cur == 'u') {
	    NEXT;
	    type = XML_REGEXP_LETTER_UPPERCASE;
	} else if (cur == 'l') {
	    NEXT;
	    type = XML_REGEXP_LETTER_LOWERCASE;
	} else if (cur == 't') {
	    NEXT;
	    type = XML_REGEXP_LETTER_TITLECASE;
	} else if (cur == 'm') {
	    NEXT;
	    type = XML_REGEXP_LETTER_MODIFIER;
	} else if (cur == 'o') {
	    NEXT;
	    type = XML_REGEXP_LETTER_OTHERS;
	} else {
	    type = XML_REGEXP_LETTER;
	}
    } else if (cur == 'M') {
	NEXT;
	cur = CUR;
	if (cur == 'n') {
	    NEXT;
	    /* nonspacing */
	    type = XML_REGEXP_MARK_NONSPACING;
	} else if (cur == 'c') {
	    NEXT;
	    /* spacing combining */
	    type = XML_REGEXP_MARK_SPACECOMBINING;
	} else if (cur == 'e') {
	    NEXT;
	    /* enclosing */
	    type = XML_REGEXP_MARK_ENCLOSING;
	} else {
	    /* all marks */
	    type = XML_REGEXP_MARK;
	}
    } else if (cur == 'N') {
	NEXT;
	cur = CUR;
	if (cur == 'd') {
	    NEXT;
	    /* digital */
	    type = XML_REGEXP_NUMBER_DECIMAL;
	} else if (cur == 'l') {
	    NEXT;
	    /* letter */
	    type = XML_REGEXP_NUMBER_LETTER;
	} else if (cur == 'o') {
	    NEXT;
	    /* other */
	    type = XML_REGEXP_NUMBER_OTHERS;
	} else {
	    /* all numbers */
	    type = XML_REGEXP_NUMBER;
	}
    } else if (cur == 'P') {
	NEXT;
	cur = CUR;
	if (cur == 'c') {
	    NEXT;
	    /* connector */
	    type = XML_REGEXP_PUNCT_CONNECTOR;
	} else if (cur == 'd') {
	    NEXT;
	    /* dash */
	    type = XML_REGEXP_PUNCT_DASH;
	} else if (cur == 's') {
	    NEXT;
	    /* open */
	    type = XML_REGEXP_PUNCT_OPEN;
	} else if (cur == 'e') {
	    NEXT;
	    /* close */
	    type = XML_REGEXP_PUNCT_CLOSE;
	} else if (cur == 'i') {
	    NEXT;
	    /* initial quote */
	    type = XML_REGEXP_PUNCT_INITQUOTE;
	} else if (cur == 'f') {
	    NEXT;
	    /* final quote */
	    type = XML_REGEXP_PUNCT_FINQUOTE;
	} else if (cur == 'o') {
	    NEXT;
	    /* other */
	    type = XML_REGEXP_PUNCT_OTHERS;
	} else {
	    /* all punctuation */
	    type = XML_REGEXP_PUNCT;
	}
    } else if (cur == 'Z') {
	NEXT;
	cur = CUR;
	if (cur == 's') {
	    NEXT;
	    /* space */
	    type = XML_REGEXP_SEPAR_SPACE;
	} else if (cur == 'l') {
	    NEXT;
	    /* line */
	    type = XML_REGEXP_SEPAR_LINE;
	} else if (cur == 'p') {
	    NEXT;
	    /* paragraph */
	    type = XML_REGEXP_SEPAR_PARA;
	} else {
	    /* all separators */
	    type = XML_REGEXP_SEPAR;
	}
    } else if (cur == 'S') {
	NEXT;
	cur = CUR;
	if (cur == 'm') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_MATH;
	    /* math */
	} else if (cur == 'c') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_CURRENCY;
	    /* currency */
	} else if (cur == 'k') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_MODIFIER;
	    /* modifiers */
	} else if (cur == 'o') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_OTHERS;
	    /* other */
	} else {
	    /* all symbols */
	    type = XML_REGEXP_SYMBOL;
	}
    } else if (cur == 'C') {
	NEXT;
	cur = CUR;
	if (cur == 'c') {
	    NEXT;
	    /* control */
	    type = XML_REGEXP_OTHER_CONTROL;
	} else if (cur == 'f') {
	    NEXT;
	    /* format */
	    type = XML_REGEXP_OTHER_FORMAT;
	} else if (cur == 'o') {
	    NEXT;
	    /* private use */
	    type = XML_REGEXP_OTHER_PRIVATE;
	} else if (cur == 'n') {
	    NEXT;
	    /* not assigned */
	    type = XML_REGEXP_OTHER_NA;
	} else {
	    /* all others */
	    type = XML_REGEXP_OTHER;
	}
    } else if (cur == 'I') {
	const xmlChar *start;
	NEXT;
	cur = CUR;
	if (cur != 's') {
	    ERROR("IsXXXX expected");
	    return;
	}
	NEXT;
	start = ctxt->cur;
	cur = CUR;
	if (((cur >= 'a') && (cur <= 'z')) ||
	    ((cur >= 'A') && (cur <= 'Z')) ||
	    ((cur >= '0') && (cur <= '9')) ||
	    (cur == 0x2D)) {
	    NEXT;
	    cur = CUR;
	    while (((cur >= 'a') && (cur <= 'z')) ||
		((cur >= 'A') && (cur <= 'Z')) ||
		((cur >= '0') && (cur <= '9')) ||
		(cur == 0x2D)) {
		NEXT;
		cur = CUR;
	    }
	}
	type = XML_REGEXP_BLOCK_NAME;
	blockName = xmlStrndup(start, ctxt->cur - start);
    } else {
	ERROR("Unknown char property");
	return;
    }
    if (ctxt->atom == NULL) {
	ctxt->atom = xmlRegNewAtom(ctxt, type);
	if (ctxt->atom != NULL)
	    ctxt->atom->valuep = blockName;
    } else if (ctxt->atom->type == XML_REGEXP_RANGES) {
        xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
		           type, 0, 0, blockName);
    }
}